

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

uint __thiscall UnionType::indexOfType(UnionType *this,Type *type)

{
  pointer ppVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  raw_ostream *this_00;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  ulong local_38 [4];
  
  ppVar1 = (this->super_AggregateType).items.
           super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->super_AggregateType).items.
                super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
  bVar7 = lVar3 != 0;
  if (bVar7) {
    if (ppVar1->first == type) {
      uVar2 = 0;
    }
    else {
      uVar6 = (lVar3 >> 3) * -0x3333333333333333;
      uVar4 = 0;
      do {
        uVar2 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar2;
        bVar8 = uVar6 - uVar4 == 0;
        bVar7 = uVar6 >= uVar4 && !bVar8;
        if (uVar6 < uVar4 || bVar8) goto LAB_0015ded7;
      } while (ppVar1[uVar4].first != type);
    }
    if (bVar7) {
      return uVar2;
    }
  }
LAB_0015ded7:
  pcVar5 = (char *)llvm::errs();
  (*type->_vptr_Type[3])(local_38,type);
  this_00 = (raw_ostream *)llvm::raw_ostream::write(pcVar5,local_38[0]);
  llvm::raw_ostream::operator<<(this_00,"\n");
  std::__cxx11::string::~string((string *)local_38);
  abort();
}

Assistant:

unsigned UnionType::indexOfType(Type* type) const {
    for (unsigned i = 0; i < items.size(); ++i) {
        if (items[i].first == type) {
            return i;
        }
    }

    llvm::errs() << type->toString() << "\n";
    assert(false && "UnionType::indexOfType: type not found in the union");
    abort();
}